

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ActivationParams * __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::_internal_mutable_activation
          (SimpleRecurrentLayerParams *this)

{
  ulong uVar1;
  ActivationParams *pAVar2;
  Arena *arena;
  
  if (this->activation_ != (ActivationParams *)0x0) {
    return this->activation_;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pAVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                     (arena);
  this->activation_ = pAVar2;
  return pAVar2;
}

Assistant:

inline ::CoreML::Specification::ActivationParams* SimpleRecurrentLayerParams::_internal_mutable_activation() {
  
  if (activation_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::ActivationParams>(GetArenaForAllocation());
    activation_ = p;
  }
  return activation_;
}